

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O2

void TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
               (int num_burnup,int num_collect,DreamPDF *probability_distribution,
               DreamDomain *inside,TasmanianDREAM *state,
               function<void_(std::vector<double,_std::allocator<double>_>_&)> *independent_update,
               function<double_()> differential_update,function<double_()> get_random01)

{
  int iVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  bool bVar2;
  int iVar3;
  long lVar4;
  size_type __n;
  ulong uVar5;
  ulong uVar6;
  runtime_error *this;
  int iVar7;
  size_t i;
  size_t sVar8;
  pointer __src;
  long lVar9;
  ulong __n_00;
  double *pdVar10;
  size_t i_1;
  size_type __n_01;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  reference rVar16;
  reference rVar17;
  allocator_type local_185;
  int local_184;
  vector<double,_std::allocator<double>_> new_state;
  unsigned_long __n2;
  vector<double,_std::allocator<double>_> candidates;
  vector<double,_std::allocator<double>_> values;
  size_t local_e8;
  vector<double,_std::allocator<double>_> new_values;
  long local_b8;
  vector<bool,_std::allocator<bool>_> valid;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  local_50;
  
  iVar1 = (int)state->num_chains;
  if (iVar1 != 0) {
    local_184 = num_burnup;
    if (state->init_state == false) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "ERROR: DREAM sampling requires that the setState() has been called first on the TasmanianDREAM."
                );
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar8 = state->num_dimensions;
    if (state->init_values == false) {
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::function(&local_50,probability_distribution);
      TasmanianDREAM::setPDFvalues(state,&local_50);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
    }
    __n_00 = (ulong)iVar1;
    lVar4 = sVar8 << 0x20;
    auVar15._8_4_ = iVar1 >> 0x1f;
    auVar15._0_8_ = __n_00;
    auVar15._12_4_ = 0x45300000;
    __n = (size_type)(int)sVar8;
    if (0 < num_collect) {
      TasmanianDREAM::expandHistory(state,num_collect);
    }
    iVar7 = 0;
    iVar3 = 0;
    if (0 < local_184) {
      iVar3 = local_184;
    }
    if (num_collect < 1) {
      num_collect = 0;
    }
    dVar11 = (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0);
    while( true ) {
      if (iVar7 == num_collect + iVar3) break;
      candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::reserve(&candidates,__n * __n_00);
      std::vector<double,_std::allocator<double>_>::reserve(&values,__n_00);
      new_state.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = 1;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&valid,__n_00,(bool *)&new_state,(allocator_type *)&new_values);
      for (sVar8 = 0; __n_00 != sVar8; sVar8 = sVar8 + 1) {
        std::vector<double,_std::allocator<double>_>::vector
                  (&new_state,__n,(allocator_type *)&new_values);
        dVar12 = std::function<double_()>::operator()
                           ((function<double_()> *)
                            differential_update.super__Function_base._M_functor._8_8_);
        dVar13 = std::function<double_()>::operator()
                           ((function<double_()> *)
                            differential_update.super__Function_base._M_functor._8_8_);
        dVar14 = std::function<double_()>::operator()
                           ((function<double_()> *)
                            differential_update.super__Function_base._M_functor._M_unused._0_8_);
        dVar12 = dVar12 * dVar11;
        uVar5 = (ulong)dVar12;
        uVar5 = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
        if (__n_00 <= uVar5) {
          uVar5 = __n_00 - 1;
        }
        dVar13 = dVar13 * dVar11;
        uVar6 = (ulong)dVar13;
        uVar6 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
        if (__n_00 <= uVar6) {
          uVar5 = __n_00 - 1;
        }
        TasmanianDREAM::getIJKdelta(state,sVar8,uVar5,uVar6,dVar14,&new_state);
        std::function<void_(std::vector<double,_std::allocator<double>_>_&)>::operator()
                  (independent_update,&new_state);
        bVar2 = std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::
                operator()(inside,&new_state);
        if (bVar2) {
          __first._M_current._1_7_ =
               new_state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._1_7_;
          __first._M_current._0_1_ =
               new_state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start._0_1_;
          std::vector<double,std::allocator<double>>::
          insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                    ((vector<double,std::allocator<double>> *)&candidates,
                     (const_iterator)
                     candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,__first,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     new_state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          std::vector<double,_std::allocator<double>_>::resize
                    (&values,((long)values.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)values.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
        }
        else {
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&valid,sVar8);
          *rVar16._M_p = *rVar16._M_p & ~rVar16._M_mask;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&new_state.super__Vector_base<double,_std::allocator<double>_>);
      }
      if (candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::
        function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
        ::operator()(probability_distribution,&candidates,&values);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&new_state,__n * __n_00,(allocator_type *)&new_values);
      std::vector<double,_std::allocator<double>_>::vector(&new_values,__n_00,&local_185);
      lVar9 = 0;
      local_b8 = 0;
      local_e8 = 0;
      __src = candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
      pdVar10 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (__n_01 = 0; __n_00 != __n_01; __n_01 = __n_01 + 1) {
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&valid,__n_01);
        uVar5 = *rVar16._M_p;
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&valid,__n_01);
        if ((*rVar17._M_p & rVar17._M_mask) == 0) {
          if ((rVar16._M_mask & uVar5) != 0) goto LAB_0011138d;
LAB_00111332:
          sVar8 = state->num_dimensions;
          if (sVar8 != 0) {
            memmove((void *)(lVar9 * 8 +
                            CONCAT71(new_state.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     new_state.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_)),
                    (state->state).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + (local_b8 >> 0x20) * sVar8,sVar8 << 3);
          }
          new_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[__n_01] =
               (state->pdf_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[__n_01];
        }
        else {
          dVar12 = *pdVar10;
          dVar13 = (state->pdf_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[__n_01];
          if (dVar12 <= dVar13) {
            dVar14 = std::function<double_()>::operator()
                               ((function<double_()> *)
                                differential_update.super__Function_base._M_functor._8_8_);
            dVar14 = log(dVar14);
            if (dVar12 - dVar13 < dVar14) goto LAB_00111332;
          }
LAB_0011138d:
          if (lVar4 != 0) {
            memmove((void *)(lVar9 * 8 +
                            CONCAT71(new_state.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     new_state.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_)),__src,
                    lVar4 >> 0x1d);
          }
          new_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[__n_01] = *pdVar10;
          local_e8 = local_e8 + 1;
        }
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&valid,__n_01);
        uVar5 = rVar16._M_mask & *rVar16._M_p;
        pdVar10 = pdVar10 + (uVar5 != 0);
        if (uVar5 != 0) {
          uVar5 = __n;
        }
        __src = __src + uVar5;
        local_b8 = local_b8 + 0x100000000;
        lVar9 = lVar9 + __n;
      }
      TasmanianDREAM::setState(state,&new_state);
      TasmanianDREAM::setPDFvalues(state,&new_values);
      if (local_184 <= iVar7) {
        TasmanianDREAM::saveStateHistory(state,local_e8);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&new_values.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&new_state.super__Vector_base<double,_std::allocator<double>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&valid.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&values.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&candidates.super__Vector_base<double,_std::allocator<double>_>);
      iVar7 = iVar7 + 1;
    }
  }
  return;
}

Assistant:

void SampleDREAM(int num_burnup, int num_collect,
                 DreamPDF probability_distribution,
                 DreamDomain inside,
                 TasmanianDREAM &state,
                 std::function<void(std::vector<double> &x)> independent_update = no_update,
                 std::function<double(void)> differential_update = const_one,
                 std::function<double(void)> get_random01 = tsgCoreUniform01){

    size_t num_chains = (size_t) state.getNumChains(), num_dimensions = (size_t) state.getNumDimensions();
    double unitlength = (double) num_chains;

    if (num_chains == 0) return; // no sampling with a null state

    if (!state.isStateReady()) throw std::runtime_error("ERROR: DREAM sampling requires that the setState() has been called first on the TasmanianDREAM.");

    if (!state.isPDFReady()) // initialize probability density (if not initialized already)
        state.setPDFvalues(probability_distribution);

    if (num_collect > 0) // pre-allocate memory for the new history
        state.expandHistory(num_collect);

    int total_iterations = std::max(num_burnup, 0) + std::max(num_collect, 0);
    for(int t = 0; t < total_iterations; t++){
        std::vector<double> candidates, values;
        candidates.reserve(num_chains * num_dimensions);
        values.reserve(num_chains);

        std::vector<bool> valid(num_chains, true); // keep track whether the samples need to be evaluated

        for(size_t i=0; i<num_chains; i++){
            std::vector<double> propose(num_dimensions);

            size_t jindex = (size_t) (get_random01() * unitlength);
            size_t kindex = (size_t) (get_random01() * unitlength);
            if (jindex >= num_chains) jindex = num_chains - 1; // this is needed in case get_random01() returns 1
            if (kindex >= num_chains) jindex = num_chains - 1;

            state.getIJKdelta(i, jindex, kindex, differential_update(), propose); // propose = s_i + w ( s_k - s_j)
            independent_update(propose); // propose += correction

            if (inside(propose)){
                candidates.insert(candidates.end(), propose.begin(), propose.end());
                values.resize(values.size() + 1);
            }else{
                valid[i] = false;
            }
        }

        if (!candidates.empty()) // block the pathological case of all proposals leaving the domain
            probability_distribution(candidates, values);

        std::vector<double> new_state(num_chains * num_dimensions), new_values(num_chains);

        auto icand = candidates.begin(); // loop over all candidates and values, accept or reject
        auto ival = values.begin();

        size_t accepted = 0;

        for(size_t i=0; i<num_chains; i++){
            bool keep_new = valid[i]; // if not valid, automatically reject
            if (valid[i]){ // apply random test
                if (*ival > state.getPDFvalue(i)){ // if the new value has higher probability, automatically accept
                    keep_new = true;
                }else{
                    if (form == regform){
                        keep_new = (*ival / state.getPDFvalue(i) >= get_random01()); // keep if the new value has higher probability
                    }else{
                        keep_new = (*ival - state.getPDFvalue(i) >= log(get_random01()));
                    }
                    //std::cout << "Trsh = " << *ival / state.getPDFvalue(i) << "   " << ((keep_new) ? "Accept" : "Reject") << std:: endl;
                }
            }

            if (keep_new){
                std::copy_n(icand, num_dimensions, new_state.begin() + i * num_dimensions);
                new_values[i] = *ival;
                accepted++; // accepted one more proposal
            }else{ // reject and reuse the old state
                state.getChainState((int) i, &*(new_state.begin() + i * num_dimensions));
                new_values[i] = state.getPDFvalue(i);
            }

            if (valid[i]){ // kept or rejected, if this sample was valid then move to the next sample in the list
                std::advance(icand, num_dimensions);
                ival++;
            }
        }

        state.setState(new_state);
        state.setPDFvalues(new_values);

        if (t >= num_burnup)
            state.saveStateHistory(accepted);
    }
}